

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnInitExprF32ConstExpr
          (BinaryReaderIR *this,Index index,uint32_t value)

{
  char *__s;
  Offset OVar1;
  ExprList *pEVar2;
  Expr *pEVar3;
  Expr *node_p;
  Expr *pEVar4;
  ExprList *pEVar5;
  Const local_88;
  char *pcStack_50;
  Location loc;
  
  __s = this->filename_;
  OVar1 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  loc.field_1.field_0.line = 0;
  loc.filename.data_ = (char *)strlen(__s);
  pEVar2 = this->current_init_expr_;
  pcStack_50 = __s;
  loc.filename.size_ = OVar1;
  Const::Const(&local_88,value,&pcStack_50);
  pEVar4 = (Expr *)operator_new(0x78);
  (pEVar4->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
  (pEVar4->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
  (pEVar4->loc).filename.data_ = pcStack_50;
  (pEVar4->loc).filename.size_ = (size_type)loc.filename.data_;
  (pEVar4->loc).field_1.field_1.offset = loc.filename.size_;
  *(ulong *)((long)&(pEVar4->loc).field_1 + 8) =
       CONCAT44(loc.field_1.field_0.first_column,loc.field_1.field_0.line);
  pEVar4->type_ = Const;
  pEVar4->_vptr_Expr = (_func_int **)&PTR__Expr_01544e68;
  *(undefined8 *)((long)&pEVar4[1].loc.field_1 + 8) = local_88.field_2._8_8_;
  pEVar4[1].loc.filename.size_ = local_88._32_8_;
  pEVar4[1].loc.field_1.field_1.offset = local_88.field_2.u64;
  pEVar4[1].super_intrusive_list_base<wabt::Expr>.prev_ =
       (Expr *)local_88.loc.field_1.field_1.offset;
  pEVar4[1].loc.filename.data_ = (char *)local_88.loc.field_1._8_8_;
  pEVar4[1]._vptr_Expr = (_func_int **)local_88.loc.filename.data_;
  pEVar4[1].super_intrusive_list_base<wabt::Expr>.next_ = (Expr *)local_88.loc.filename.size_;
  pEVar3 = pEVar2->last_;
  pEVar5 = pEVar2;
  if (pEVar3 != (Expr *)0x0) {
    (pEVar4->super_intrusive_list_base<wabt::Expr>).prev_ = pEVar3;
    pEVar5 = (ExprList *)&pEVar3->super_intrusive_list_base<wabt::Expr>;
  }
  pEVar5->first_ = pEVar4;
  pEVar2->last_ = pEVar4;
  pEVar2->size_ = pEVar2->size_ + 1;
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnInitExprF32ConstExpr(Index index, uint32_t value) {
  Location loc = GetLocation();
  current_init_expr_->push_back(
      MakeUnique<ConstExpr>(Const::F32(value, loc), loc));
  return Result::Ok;
}